

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Spline.H
# Opt level: O3

void __thiscall
amrex::EB2::SplineIF::addLineElement
          (SplineIF *this,vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *pts)

{
  pointer *pppdVar1;
  iterator __position;
  LineDistFcnElement2d *this_00;
  LineDistFcnElement2d *local_40;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> local_38;
  
  this_00 = (LineDistFcnElement2d *)operator_new(0x38);
  (this_00->super_distFcnElement2d)._vptr_distFcnElement2d =
       (_func_int **)&PTR_newDistFcnElement2d_0080e000;
  (this_00->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->control_points_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->control_points_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->control_points_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>::vector(&local_38,pts);
  LineDistFcnElement2d::set_control_points(this_00,&local_38);
  if (local_38.super__Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  __position._M_current =
       (this->geomElements).
       super_vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>.
       super__Vector_base<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->geomElements).
      super_vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>.
      super__Vector_base<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40 = this_00;
    std::vector<amrex::distFcnElement2d*,std::allocator<amrex::distFcnElement2d*>>::
    _M_realloc_insert<amrex::distFcnElement2d*>
              ((vector<amrex::distFcnElement2d*,std::allocator<amrex::distFcnElement2d*>> *)this,
               __position,(distFcnElement2d **)&local_40);
  }
  else {
    *__position._M_current = (distFcnElement2d *)this_00;
    pppdVar1 = &(this->geomElements).
                super_vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>.
                super__Vector_base<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppdVar1 = *pppdVar1 + 1;
  }
  return;
}

Assistant:

void addLineElement(std::vector<amrex::RealVect> pts) {
    LineDistFcnElement2d * theLine = new LineDistFcnElement2d();
    theLine->set_control_points(pts);
    geomElements.push_back(theLine);
  }